

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# etdc.c
# Opt level: O2

void etdc_add(etdc_table **table,uint s)

{
  long *plVar1;
  UT_hash_bucket *pUVar2;
  UT_hash_table *pUVar3;
  UT_hash_bucket *__ptr;
  UT_hash_handle *pUVar4;
  UT_hash_handle *pUVar5;
  UT_hash_handle *pUVar6;
  etdc_table *peVar7;
  UT_hash_table *pUVar8;
  etdc_table *peVar9;
  UT_hash_bucket *pUVar10;
  uint uVar11;
  long lVar12;
  uint uVar13;
  uint uVar14;
  ulong uVar15;
  uint uVar16;
  uint uVar17;
  UT_hash_handle *pUVar18;
  uint uVar19;
  uint s_local;
  
  if (*table != (etdc_table *)0x0) {
    uVar14 = (int)(char)s +
             ((int)(short)s & 0xffffff00U) + (s & 0xff000000) + ((int)(s << 8) >> 8 & 0xffff0000U) +
             0x112410d ^ 0x7f76d;
    uVar11 = uVar14 << 8 ^ 0x9f49bac6 - uVar14;
    uVar17 = uVar11 >> 0xd ^ (-0x112410d - uVar14) - uVar11;
    uVar19 = uVar17 >> 0xc ^ (uVar14 - uVar11) - uVar17;
    uVar14 = uVar19 << 0x10 ^ (uVar11 - uVar17) - uVar19;
    uVar11 = uVar14 >> 5 ^ (uVar17 - uVar19) - uVar14;
    uVar17 = uVar11 >> 3 ^ (uVar19 - uVar14) - uVar11;
    uVar14 = uVar17 << 10 ^ (uVar14 - uVar11) - uVar17;
    pUVar8 = ((*table)->hh).tbl;
    pUVar6 = pUVar8->buckets[pUVar8->num_buckets - 1 & (uVar14 >> 0xf ^ uVar11 - (uVar17 + uVar14))]
             .hh_head;
    if (pUVar6 == (UT_hash_handle *)0x0) {
      lVar12 = 0;
    }
    else {
      lVar12 = (long)pUVar6 - pUVar8->hho;
    }
    while (lVar12 != 0) {
      if ((*(int *)(lVar12 + 0x48) == 4) && (**(uint **)(lVar12 + 0x40) == s)) {
        *(int *)(lVar12 + 4) = *(int *)(lVar12 + 4) + 1;
        return;
      }
      plVar1 = (long *)(lVar12 + 0x38);
      lVar12 = 0;
      if (*plVar1 != 0) {
        lVar12 = *plVar1 - pUVar8->hho;
      }
    }
  }
  peVar7 = (etdc_table *)malloc(0x50);
  peVar7->symbol = s;
  peVar7->freq = 1;
  pUVar6 = &peVar7->hh;
  (peVar7->hh).next = (void *)0x0;
  (peVar7->hh).key = peVar7;
  (peVar7->hh).keylen = 4;
  if (*table == (etdc_table *)0x0) {
    *table = peVar7;
    (peVar7->hh).prev = (void *)0x0;
    pUVar8 = (UT_hash_table *)calloc(1,0x40);
    (peVar7->hh).tbl = pUVar8;
    if (pUVar8 == (UT_hash_table *)0x0) goto LAB_00101a82;
    pUVar8->tail = pUVar6;
    pUVar8->num_buckets = 0x20;
    pUVar8->log2_num_buckets = 5;
    pUVar8->hho = 0x18;
    pUVar10 = (UT_hash_bucket *)calloc(1,0x200);
    pUVar8->buckets = pUVar10;
    if (pUVar10 == (UT_hash_bucket *)0x0) goto LAB_00101a82;
    pUVar8->signature = 0xa0111fe1;
    peVar9 = peVar7;
  }
  else {
    (((*table)->hh).tbl)->tail->next = peVar7;
    pUVar8 = ((*table)->hh).tbl;
    (peVar7->hh).prev = (void *)((long)pUVar8->tail - pUVar8->hho);
    pUVar8->tail = pUVar6;
    pUVar8 = ((*table)->hh).tbl;
    peVar9 = *table;
  }
  uVar17 = pUVar8->num_items + 1;
  pUVar8->num_items = uVar17;
  (peVar7->hh).tbl = pUVar8;
  uVar14 = (int)(char)peVar7->symbol +
           *(char *)((long)&peVar7->symbol + 1) * 0x100 +
           *(char *)((long)&peVar7->symbol + 2) * 0x10000 +
           (uint)*(byte *)((long)&peVar7->symbol + 3) * 0x1000000 + 0x112410d ^ 0x7f76d;
  uVar11 = uVar14 << 8 ^ 0x9f49bac6 - uVar14;
  uVar19 = uVar11 >> 0xd ^ (-0x112410d - uVar14) - uVar11;
  uVar16 = uVar19 >> 0xc ^ (uVar14 - uVar11) - uVar19;
  uVar14 = uVar16 << 0x10 ^ (uVar11 - uVar19) - uVar16;
  uVar11 = uVar14 >> 5 ^ (uVar19 - uVar16) - uVar14;
  uVar19 = uVar11 >> 3 ^ (uVar16 - uVar14) - uVar11;
  uVar14 = uVar19 << 10 ^ (uVar14 - uVar11) - uVar19;
  uVar11 = uVar14 >> 0xf ^ uVar11 - (uVar19 + uVar14);
  (peVar7->hh).hashv = uVar11;
  pUVar3 = (peVar9->hh).tbl;
  uVar11 = pUVar3->num_buckets - 1 & uVar11;
  pUVar10 = pUVar3->buckets;
  pUVar10[uVar11].count = pUVar10[uVar11].count + 1;
  pUVar18 = pUVar10[uVar11].hh_head;
  (peVar7->hh).hh_next = pUVar18;
  (peVar7->hh).hh_prev = (UT_hash_handle *)0x0;
  if (pUVar18 != (UT_hash_handle *)0x0) {
    pUVar18->hh_prev = pUVar6;
    pUVar10 = (((*table)->hh).tbl)->buckets;
  }
  pUVar10[uVar11].hh_head = pUVar6;
  pUVar10 = (((*table)->hh).tbl)->buckets;
  if ((pUVar10[uVar11].expand_mult * 10 + 10 <= pUVar10[uVar11].count) && (pUVar8->noexpand != 1)) {
    uVar11 = pUVar8->num_buckets;
    uVar14 = uVar11 * 2;
    pUVar10 = (UT_hash_bucket *)calloc(1,(ulong)uVar14 << 4);
    if (pUVar10 == (UT_hash_bucket *)0x0) {
LAB_00101a82:
      exit(-1);
    }
    uVar14 = uVar14 - 1;
    uVar19 = ((uVar17 >> ((char)pUVar8->log2_num_buckets + 1U & 0x1f)) + 1) -
             (uint)((uVar14 & uVar17) == 0);
    pUVar8->ideal_chain_maxlen = uVar19;
    pUVar8->nonideal_items = 0;
    __ptr = pUVar8->buckets;
    uVar17 = 0;
    for (uVar15 = 0; uVar15 != uVar11; uVar15 = uVar15 + 1) {
      pUVar18 = __ptr[uVar15].hh_head;
      while (pUVar18 != (UT_hash_handle *)0x0) {
        pUVar4 = pUVar18->hh_next;
        uVar13 = pUVar18->hashv & uVar14;
        pUVar2 = pUVar10 + uVar13;
        uVar16 = pUVar10[uVar13].count + 1;
        pUVar10[uVar13].count = uVar16;
        if (uVar19 < uVar16) {
          uVar17 = uVar17 + 1;
          pUVar8->nonideal_items = uVar17;
          pUVar2->expand_mult = uVar16 / uVar19;
        }
        pUVar18->hh_prev = (UT_hash_handle *)0x0;
        pUVar5 = pUVar2->hh_head;
        pUVar18->hh_next = pUVar5;
        if (pUVar5 != (UT_hash_handle *)0x0) {
          pUVar5->hh_prev = pUVar18;
        }
        pUVar2->hh_head = pUVar18;
        pUVar18 = pUVar4;
      }
    }
    free(__ptr);
    pUVar8 = pUVar6->tbl;
    pUVar8->num_buckets = pUVar8->num_buckets << 1;
    pUVar8->log2_num_buckets = pUVar8->log2_num_buckets + 1;
    pUVar8->buckets = pUVar10;
    if (pUVar8->num_items >> 1 < pUVar8->nonideal_items) {
      uVar11 = pUVar8->ineff_expands + 1;
      pUVar8->ineff_expands = uVar11;
      if (1 < uVar11) {
        pUVar8->noexpand = 1;
      }
    }
    else {
      pUVar8->ineff_expands = 0;
    }
  }
  return;
}

Assistant:

void etdc_add(struct etdc_table **table, unsigned int s) {
  struct etdc_table *e;

  HASH_FIND_INT( *table, &s, e);

  if (NULL == e) {
    //add symbol to table
    //fprintf(stderr,"No symbol found in table... creating one");
    etdc_new_symbol(table, s);
  } else {
    //increment frequency
    //fprintf(stderr,"Incrementing frequency of symbol in etdc table");
    e->freq++;
  }
}